

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

bool __thiscall slang::ast::PortSymbol::isNetPort(PortSymbol *this)

{
  bool bVar1;
  
  getType(this);
  if (this->internalExpr == (Expression *)0x0) {
    if (this->internalSymbol == (Symbol *)0x0) {
      bVar1 = false;
    }
    else {
      bVar1 = this->internalSymbol->kind == Net;
    }
  }
  else {
    bVar1 = isNetPortImpl(this->internalExpr);
  }
  return bVar1;
}

Assistant:

bool PortSymbol::isNetPort() const {
    if (auto ie = getInternalExpr())
        return isNetPortImpl(*ie);

    return internalSymbol && internalSymbol->kind == SymbolKind::Net;
}